

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,char *filename)

{
  uint key;
  REF_INT *pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_DBL *pRVar3;
  REF_GEOM pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  uint uVar7;
  uint uVar8;
  FILE *pFVar9;
  REF_DBL *pRVar10;
  ulong uVar11;
  long lVar12;
  REF_GEOM pRVar13;
  int iVar14;
  long lVar15;
  undefined8 uVar16;
  REF_INT RVar17;
  ulong uVar18;
  REF_GEOM pRVar19;
  REF_GEOM pRVar20;
  REF_CELL pRVar21;
  char *pcVar22;
  uint uVar23;
  int iVar24;
  REF_NODE pRVar25;
  bool bVar26;
  double dVar27;
  REF_GEOM pRVar28;
  REF_GEOM pRVar29;
  REF_INT local;
  REF_INT sens;
  REF_DICT ref_dict;
  REF_DBL radius;
  REF_DBL tvalue;
  REF_INT sens_1;
  REF_DBL normal [3];
  REF_DBL param [2];
  REF_INT nodes [27];
  char *pcVar30;
  REF_INT local_174;
  REF_CELL local_170;
  int local_164;
  REF_GEOM local_160;
  REF_DICT local_158;
  REF_NODE local_150;
  REF_DICT local_148;
  REF_DICT local_140;
  REF_GEOM local_138;
  FILE *local_130;
  REF_DBL *local_128;
  REF_FACELIFT local_120;
  REF_GEOM local_118;
  REF_GEOM local_110;
  REF_GEOM local_108;
  uint local_100;
  uint local_fc;
  REF_GEOM local_f8;
  REF_GEOM local_f0;
  REF_GEOM local_e8;
  ulong local_e0;
  REF_GEOM local_d8;
  REF_GEOM local_d0;
  REF_GEOM local_c8;
  ulong local_b8;
  REF_GEOM local_b0;
  uint local_a8 [28];
  REF_GEOM local_38;
  
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x4f5,"ref_facelift_tec","requires indirect facelift");
    RVar6 = 1;
  }
  else {
    pRVar13 = ref_facelift->grid->geom;
    pFVar9 = fopen(filename,"w");
    if (pFVar9 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x4f9,"ref_facelift_tec","unable to open file");
      RVar6 = 2;
    }
    else {
      fwrite("title=\"refine watertight cad displacement\"\n",0x2b,1,pFVar9);
      local_130 = pFVar9;
      fwrite("variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n",0x33,1,pFVar9)
      ;
      if ((long)pRVar13->max < 1) {
        uVar5 = 0x80000000;
        pRVar25 = (REF_NODE)0x7fffffff;
      }
      else {
        pRVar25 = (REF_NODE)0x7fffffff;
        uVar5 = 0x80000000;
        lVar15 = 0;
        do {
          if (*(int *)((long)pRVar13->descr + lVar15) == 1) {
            uVar23 = *(uint *)((long)pRVar13->descr + lVar15 + 4);
            if ((int)uVar23 <= (int)pRVar25) {
              pRVar25 = (REF_NODE)(ulong)uVar23;
            }
            if ((int)uVar5 <= (int)uVar23) {
              uVar5 = uVar23;
            }
          }
          lVar15 = lVar15 + 0x18;
        } while ((long)pRVar13->max * 0x18 != lVar15);
      }
      local_120 = ref_facelift;
      local_108 = pRVar13;
      if ((int)pRVar25 <= (int)uVar5) {
        local_128 = (REF_DBL *)CONCAT44(local_128._4_4_,uVar5);
        do {
          if (local_120->displacement == (REF_DBL *)0x0) {
            uVar16 = 0x3c7;
            pcVar30 = "requires indirect facelift";
LAB_001b8399:
            uVar23 = (uint)pRVar25;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,uVar16,"ref_facelift_edge_tec_zone",pcVar30);
            uVar5 = 1;
            goto LAB_001b83a6;
          }
          pRVar21 = local_120->edg_cell;
          pRVar13 = (REF_GEOM)local_120->grid->node;
          pRVar28 = local_120->grid->geom;
          local_150 = pRVar25;
          uVar5 = ref_dict_create(&local_158);
          pRVar25 = local_150;
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x3c9,"ref_facelift_edge_tec_zone",(ulong)uVar5,"create dict");
            uVar23 = (uint)local_150;
            goto LAB_001b83a6;
          }
          local_170 = (REF_CELL)((ulong)local_170 & 0xffffffff00000000);
          uVar23 = (uint)local_150;
          local_118 = pRVar13;
          if (pRVar28->max < 1) {
            local_160 = (REF_GEOM)0xffffffff;
          }
          else {
            local_160 = (REF_GEOM)0xffffffff;
            lVar15 = 0;
            uVar18 = 0;
            do {
              pRVar1 = pRVar28->descr;
              if ((*(int *)((long)pRVar1 + lVar15) == 1) &&
                 (*(uint *)((long)pRVar1 + lVar15 + 4) == uVar23)) {
                uVar5 = ref_dict_store(local_158,*(REF_INT *)((long)pRVar1 + lVar15 + 0x14),
                                       (REF_INT)uVar18);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x3ce,"ref_facelift_edge_tec_zone",(ulong)uVar5,"mark nodes");
                  local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                  goto LAB_001b8c3e;
                }
                if (*(int *)((long)pRVar28->descr + lVar15 + 0xc) != 0) {
                  iVar14 = (int)local_160;
                  if (iVar14 != -1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x3d0,"ref_facelift_edge_tec_zone","should be only one jump per edge",
                           0xffffffffffffffff,(long)iVar14);
                    iVar14 = (int)local_160;
                    local_170 = (REF_CELL)CONCAT44(local_170._4_4_,1);
                  }
                  if (iVar14 != -1) goto LAB_001b8c3e;
                  local_160 = (REF_GEOM)(uVar18 & 0xffffffff);
                }
              }
              uVar18 = uVar18 + 1;
              lVar15 = lVar15 + 0x18;
            } while ((long)uVar18 < (long)pRVar28->max);
          }
          local_e0 = (ulong)((uint)((int)local_160 != -1) + local_158->n);
          if (pRVar21->max < 1) {
            uVar5 = 0;
          }
          else {
            RVar17 = 0;
            uVar5 = 0;
            do {
              RVar6 = ref_cell_nodes(pRVar21,RVar17,(REF_INT *)local_a8);
              uVar5 = uVar5 + (local_a8[2] == uVar23 && RVar6 == 0);
              RVar17 = RVar17 + 1;
            } while (RVar17 < pRVar21->max);
          }
          uVar18 = local_e0;
          iVar14 = (int)local_e0;
          if ((iVar14 == 0) || (uVar5 == 0)) {
            uVar5 = ref_dict_free(local_158);
            if (uVar5 == 0) {
LAB_001b90db:
              uVar5 = 0;
            }
            else {
              uVar16 = 0x3e1;
LAB_001b8c77:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,uVar16,"ref_facelift_edge_tec_zone",(ulong)uVar5,"free dict");
            }
          }
          else {
            pcVar30 = "felineseg";
            fprintf(local_130,
                    "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                    (ulong)pRVar25 & 0xffffffff,local_e0 & 0xffffffff,(ulong)uVar5,"point",
                    "felineseg");
            if (iVar14 < 0) {
              uVar16 = 0x3ea;
              pcVar30 = "malloc t of REF_DBL negative";
              goto LAB_001b8399;
            }
            uVar18 = uVar18 & 0xffffffff;
            local_150 = (REF_NODE)malloc(uVar18 * 8);
            if (local_150 == (REF_NODE)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x3ea,"ref_facelift_edge_tec_zone","malloc t of REF_DBL NULL");
              uVar5 = 2;
              goto LAB_001b83a6;
            }
            local_b8 = uVar18;
            if (0 < pRVar21->max) {
              local_138 = (REF_GEOM)CONCAT44(local_138._4_4_,iVar14 + -1);
              iVar14 = 0;
              do {
                RVar6 = ref_cell_nodes(pRVar21,iVar14,(REF_INT *)local_a8);
                if ((RVar6 == 0) && (local_a8[2] == uVar23)) {
                  uVar5 = ref_dict_location(local_158,local_a8[0],&local_174);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x3f1,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                    printf("edg %d %d id %d no edge geom\n",(ulong)local_a8[0],(ulong)local_a8[1],
                           (ulong)local_a8[2]);
                    uVar8 = ref_node_location((REF_NODE)local_118,local_a8[0]);
                    if (uVar8 == 0) {
                      uVar8 = ref_geom_tattle(pRVar28,local_a8[0]);
                      local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x3f0,"ref_facelift_edge_tec_zone",(ulong)uVar8,"tatt");
                        local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar8);
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x3ef,"ref_facelift_edge_tec_zone",(ulong)uVar8,"loc");
                      local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar8);
                    }
                  }
                  if (uVar5 != 0) goto LAB_001b8c3e;
                  uVar5 = ref_geom_cell_tuv(pRVar28,local_a8[0],(REF_INT *)local_a8,1,
                                            (REF_DBL *)&local_140,&local_164);
                  pRVar25 = local_150;
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x3f4,"ref_facelift_edge_tec_zone",(ulong)uVar5,"from");
                    local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                    goto LAB_001b8c3e;
                  }
                  if (local_164 == -1) {
                    local_174 = (int)local_138;
                  }
                  *(REF_DICT *)(&local_150->n + (long)local_174 * 2) = local_140;
                  uVar5 = ref_dict_location(local_158,local_a8[1],&local_174);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x3f7,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                    local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                    goto LAB_001b8c3e;
                  }
                  uVar5 = ref_geom_cell_tuv(pRVar28,local_a8[1],(REF_INT *)local_a8,1,
                                            (REF_DBL *)&local_140,&local_164);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x3fa,"ref_facelift_edge_tec_zone",(ulong)uVar5);
                    local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                    goto LAB_001b8c3e;
                  }
                  if (local_164 == -1) {
                    local_174 = (int)local_138;
                  }
                  *(REF_DICT *)(&pRVar25->n + (long)local_174 * 2) = local_140;
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < pRVar21->max);
            }
            pRVar13 = local_118;
            if (0 < local_158->n) {
              iVar14 = *local_158->key;
              pRVar19 = (REF_GEOM)(ulong)(uint)*local_158->value;
              lVar15 = 0;
              pRVar20 = (REF_GEOM)0x0;
              do {
                local_148 = (REF_DICT)0x0;
                pRVar10 = pRVar13->face_seg_per_rad;
                lVar12 = (long)(iVar14 * 0xf);
                local_d8 = (REF_GEOM)pRVar10[lVar12];
                local_d0 = (REF_GEOM)pRVar10[lVar12 + 1];
                local_c8 = (REF_GEOM)pRVar10[lVar12 + 2];
                local_138 = pRVar20;
                if (pRVar28->model == (void *)0x0) {
                }
                else {
                  local_110 = pRVar19;
                  uVar5 = ref_egads_edge_curvature
                                    (pRVar28,(REF_INT)pRVar19,(REF_DBL *)&local_148,
                                     (REF_DBL *)&local_f8);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x406,"ref_facelift_edge_tec_zone",(ulong)uVar5);
                    local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                    goto LAB_001b8c3e;
                  }
                  if ((double)local_148 <= -(double)local_148) {
                    local_148 = (REF_DICT)-(double)local_148;
                  }
                  uVar8 = ref_egads_eval_at(pRVar28,1,uVar23,
                                            (REF_DBL *)((long)&local_150->n + lVar15),
                                            (REF_DBL *)&local_d8,(REF_DBL *)0x0);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x409,"ref_facelift_edge_tec_zone",(ulong)uVar8);
                    local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar8);
                  }
                  pRVar19 = local_110;
                  uVar5 = (uint)local_170;
                  if (uVar8 != 0) goto LAB_001b83a6;
                }
                pRVar10 = local_120->displacement;
                lVar12 = (long)((int)pRVar19 * 3);
                dVar27 = pRVar10[lVar12 + 2] * pRVar10[lVar12 + 2] +
                         pRVar10[lVar12 + 1] * pRVar10[lVar12 + 1] +
                         pRVar10[lVar12] * pRVar10[lVar12];
                if (dVar27 < 0.0) {
                  local_110 = local_d8;
                  local_b0 = local_d0;
                  local_38 = local_c8;
                  dVar27 = sqrt(dVar27);
                  pRVar20 = local_b0;
                  pRVar19 = local_38;
                  pRVar29 = local_110;
                }
                else {
                  dVar27 = SQRT(dVar27);
                  pRVar20 = local_d0;
                  pRVar19 = local_c8;
                  pRVar29 = local_d8;
                }
                pRVar13 = local_118;
                pRVar4 = local_138;
                pRVar10 = local_120->displacement;
                pcVar30 = (char *)pRVar10[lVar12 + 2];
                fprintf(local_130," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar29
                        ,pRVar20,pRVar19,dVar27,*(undefined8 *)(&local_150->n + (long)local_138 * 2)
                        ,0,pRVar10[lVar12],pRVar10[lVar12 + 1]);
                pRVar20 = (REF_GEOM)((long)&pRVar4->n + 1);
                pRVar19 = (REF_GEOM)0xffffffff;
                iVar14 = -1;
                if ((long)pRVar20 < (long)local_158->n) {
                  iVar14 = local_158->key[(long)((long)&pRVar4->n + 1)];
                  pRVar19 = (REF_GEOM)(ulong)(uint)local_158->value[(long)((long)&pRVar4->n + 1)];
                }
                lVar15 = lVar15 + 8;
              } while ((long)pRVar20 < (long)local_158->n);
            }
            iVar14 = (int)local_160;
            pRVar25 = local_150;
            if (iVar14 == -1) {
LAB_001b8e7d:
              free(pRVar25);
              if (0 < pRVar21->max) {
                iVar24 = (int)local_e0 + -1;
                iVar14 = 0;
                do {
                  RVar6 = ref_cell_nodes(pRVar21,iVar14,(REF_INT *)local_a8);
                  if ((RVar6 == 0) && (local_a8[2] == uVar23)) {
                    uVar5 = ref_dict_location(local_158,local_a8[0],&local_174);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x42b,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                      local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                      goto LAB_001b8c3e;
                    }
                    uVar5 = ref_geom_cell_tuv(pRVar28,local_a8[0],(REF_INT *)local_a8,1,
                                              (REF_DBL *)&local_140,&local_164);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x42e,"ref_facelift_edge_tec_zone",(ulong)uVar5,"from");
                      local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                      goto LAB_001b8c3e;
                    }
                    if (local_164 == -1) {
                      local_174 = iVar24;
                    }
                    fprintf(local_130," %d",(ulong)(local_174 + 1));
                    uVar5 = ref_dict_location(local_158,local_a8[1],&local_174);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x431,"ref_facelift_edge_tec_zone",(ulong)uVar5,"localize");
                      local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                      goto LAB_001b8c3e;
                    }
                    uVar5 = ref_geom_cell_tuv(pRVar28,local_a8[1],(REF_INT *)local_a8,1,
                                              (REF_DBL *)&local_140,&local_164);
                    pFVar9 = local_130;
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x434,"ref_facelift_edge_tec_zone",(ulong)uVar5,"from");
                      local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
                      goto LAB_001b8c3e;
                    }
                    if (local_164 == -1) {
                      local_174 = iVar24;
                    }
                    fprintf(local_130," %d",(ulong)(local_174 + 1));
                    fputc(10,pFVar9);
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar14 < pRVar21->max);
              }
              uVar5 = ref_dict_free(local_158);
              if (uVar5 == 0) goto LAB_001b90db;
              uVar16 = 0x43b;
              goto LAB_001b8c77;
            }
            lVar15 = (long)pRVar28->descr[(long)(iVar14 * 6) + 5];
            local_148 = (REF_DICT)0x0;
            pRVar10 = pRVar13->face_seg_per_rad;
            local_d8 = (REF_GEOM)pRVar10[lVar15 * 0xf];
            local_d0 = (REF_GEOM)pRVar10[lVar15 * 0xf + 1];
            local_c8 = (REF_GEOM)pRVar10[lVar15 * 0xf + 2];
            if (pRVar28->model == (void *)0x0) {
LAB_001b8cf4:
              pRVar10 = local_120->displacement;
              lVar15 = (long)((int)local_160 * 3);
              dVar27 = pRVar10[lVar15 + 2] * pRVar10[lVar15 + 2] +
                       pRVar10[lVar15 + 1] * pRVar10[lVar15 + 1] + pRVar10[lVar15] * pRVar10[lVar15]
              ;
              if (dVar27 < 0.0) {
                local_160 = local_d8;
                local_118 = local_d0;
                local_138 = local_c8;
                dVar27 = sqrt(dVar27);
                pRVar13 = local_118;
                pRVar20 = local_138;
                pRVar19 = local_160;
              }
              else {
                dVar27 = SQRT(dVar27);
                pRVar13 = local_d0;
                pRVar20 = local_c8;
                pRVar19 = local_d8;
              }
              pRVar25 = local_150;
              fprintf(local_130," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar19,
                      pRVar13,pRVar20,dVar27,*(undefined8 *)((long)local_150 + local_b8 * 8 + -8),0,
                      local_120->displacement[lVar15],local_120->displacement[lVar15 + 1]);
              goto LAB_001b8e7d;
            }
            uVar5 = ref_egads_edge_curvature
                              (pRVar28,iVar14,(REF_DBL *)&local_148,(REF_DBL *)&local_f8);
            if (uVar5 == 0) {
              if ((double)local_148 <= -(double)local_148) {
                local_148 = (REF_DICT)-(double)local_148;
              }
              uVar8 = ref_egads_eval_at(pRVar28,1,uVar23,
                                        (REF_DBL *)((long)local_150 + local_b8 * 8 + -8),
                                        (REF_DBL *)&local_d8,(REF_DBL *)0x0);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x41d,"ref_facelift_edge_tec_zone",(ulong)uVar8,"eval at",pcVar30);
                local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar8);
              }
              uVar5 = (uint)local_170;
              if (uVar8 == 0) goto LAB_001b8cf4;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x419,"ref_facelift_edge_tec_zone",(ulong)uVar5,"curve",pcVar30);
              local_170 = (REF_CELL)CONCAT44(local_170._4_4_,uVar5);
LAB_001b8c3e:
              uVar5 = (uint)local_170;
            }
          }
LAB_001b83a6:
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x508,"ref_facelift_tec",(ulong)uVar5,"tec edge");
            local_100 = uVar5;
          }
          if (uVar5 != 0) {
            return local_100;
          }
          pRVar25 = (REF_NODE)(ulong)(uVar23 + 1);
        } while (uVar23 != (uint)local_128);
      }
      if ((long)local_108->max < 1) {
        uVar23 = 0x80000000;
        uVar5 = 0x7fffffff;
      }
      else {
        uVar5 = 0x7fffffff;
        uVar23 = 0x80000000;
        lVar15 = 0;
        do {
          if (*(int *)((long)local_108->descr + lVar15) == 2) {
            uVar8 = *(uint *)((long)local_108->descr + lVar15 + 4);
            if ((int)uVar8 <= (int)uVar5) {
              uVar5 = uVar8;
            }
            if ((int)uVar23 <= (int)uVar8) {
              uVar23 = uVar8;
            }
          }
          lVar15 = lVar15 + 0x18;
        } while ((long)local_108->max * 0x18 != lVar15);
      }
      if ((int)uVar5 <= (int)uVar23) {
        do {
          if (local_120->displacement == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x44e,"ref_facelift_face_tec_zone","requires indirect facelift");
            uVar8 = 1;
          }
          else {
            pRVar21 = local_120->tri_cell;
            pRVar25 = local_120->grid->node;
            pRVar13 = local_120->grid->geom;
            uVar7 = ref_dict_create(&local_158);
            if (uVar7 == 0) {
              local_170 = pRVar21;
              local_150 = pRVar25;
              uVar8 = ref_dict_create(&local_140);
              if (uVar8 == 0) {
                uVar8 = ref_dict_create(&local_148);
                if (uVar8 == 0) {
                  local_174 = 0;
                  pRVar21 = local_170;
                  local_160 = pRVar13;
                  if (0 < pRVar13->max) {
                    do {
                      pRVar13 = local_160;
                      pRVar1 = local_160->descr;
                      uVar8 = local_174 * 6;
                      if ((pRVar1[(int)uVar8] == 2) && (pRVar1[(int)(uVar8 | 1)] == uVar5)) {
                        key = pRVar1[(long)(int)uVar8 + 5];
                        pRVar10 = (REF_DBL *)(ulong)key;
                        if (pRVar1[(long)(int)uVar8 + 4] == 0) {
                          uVar8 = ref_dict_store(local_158,key,local_174);
                          if (uVar8 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x458,"ref_facelift_face_tec_zone",(ulong)uVar8,"mark nodes");
                            goto LAB_001b9226;
                          }
                          pRVar21 = local_170;
                          if ((pRVar13->descr[(long)local_174 * 6 + 3] != 0) &&
                             (uVar8 = ref_dict_store(local_140,key,local_174), pRVar21 = local_170,
                             uVar8 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x45a,"ref_facelift_face_tec_zone",(ulong)uVar8,"mark jump");
                            goto LAB_001b9226;
                          }
                        }
                        else {
                          RVar17 = -1;
                          uVar18 = 0xffffffff;
                          if (-1 < (int)key) {
                            uVar18 = 0xffffffff;
                            if ((int)key < pRVar21->ref_adj->nnode) {
                              uVar18 = (ulong)(uint)pRVar21->ref_adj->first[(long)pRVar10];
                            }
                          }
                          local_128 = pRVar10;
                          if ((int)uVar18 != -1) {
                            RVar17 = pRVar21->ref_adj->item[(int)uVar18].ref;
                          }
                          while ((int)uVar18 != -1) {
                            uVar8 = ref_cell_nodes(pRVar21,RVar17,(REF_INT *)local_a8);
                            if (uVar8 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                     ,0x45e,"ref_facelift_face_tec_zone",(ulong)uVar8,"nodes");
                              goto LAB_001b9226;
                            }
                            if (local_a8[3] == uVar5) {
                              uVar8 = ref_dict_store(local_148,RVar17,(REF_INT)local_128);
                              if (uVar8 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                       ,0x460,"ref_facelift_face_tec_zone",(ulong)uVar8,"mark degen"
                                      );
                                goto LAB_001b9226;
                              }
                            }
                            pRVar2 = local_170->ref_adj->item;
                            uVar18 = (ulong)pRVar2[(int)uVar18].next;
                            pRVar21 = local_170;
                            if (uVar18 == 0xffffffffffffffff) {
                              RVar17 = -1;
                            }
                            else {
                              RVar17 = pRVar2[uVar18].ref;
                            }
                          }
                        }
                      }
                      local_174 = local_174 + 1;
                    } while (local_174 < local_160->max);
                  }
                  local_e0 = (ulong)local_158->n;
                  iVar14 = local_140->n + local_158->n;
                  local_118 = (REF_GEOM)CONCAT44(local_118._4_4_,iVar14);
                  local_128 = (REF_DBL *)(ulong)(uint)(local_148->n + iVar14);
                  if (pRVar21->max < 1) {
                    uVar18 = 0;
                  }
                  else {
                    iVar14 = 0;
                    uVar18 = 0;
                    do {
                      RVar6 = ref_cell_nodes(local_170,iVar14,(REF_INT *)local_a8);
                      uVar18 = (ulong)((int)uVar18 + (uint)(local_a8[3] == uVar5 && RVar6 == 0));
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < local_170->max);
                  }
                  iVar14 = (int)local_128;
                  if ((iVar14 == 0) || ((int)uVar18 == 0)) {
                    uVar8 = ref_dict_free(local_148);
                    if (uVar8 == 0) {
                      uVar8 = ref_dict_free(local_140);
                      if (uVar8 == 0) {
                        uVar8 = ref_dict_free(local_158);
                        if (uVar8 != 0) {
                          uVar16 = 0x477;
                          goto LAB_001b967f;
                        }
LAB_001ba377:
                        uVar8 = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x476,"ref_facelift_face_tec_zone",(ulong)uVar8,"free jump");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x475,"ref_facelift_face_tec_zone",(ulong)uVar8,"free degen");
                    }
                  }
                  else {
                    pcVar30 = "fetriangle";
                    fprintf(local_130,
                            "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                            ,(ulong)uVar5,(ulong)local_128 & 0xffffffff,uVar18,"point","fetriangle")
                    ;
                    if (iVar14 < 0) {
                      uVar8 = 1;
                      pcVar22 = "malloc uv of REF_DBL negative";
LAB_001b96b6:
                      bVar26 = false;
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x480,"ref_facelift_face_tec_zone",pcVar22);
                      local_128 = (REF_DBL *)0x0;
                    }
                    else {
                      uVar8 = iVar14 * 2;
                      uVar18 = (ulong)uVar8;
                      pRVar10 = (REF_DBL *)malloc((ulong)uVar8 << 3);
                      if (pRVar10 == (REF_DBL *)0x0) {
                        uVar8 = 2;
                        pcVar22 = "malloc uv of REF_DBL NULL";
                        goto LAB_001b96b6;
                      }
                      if ((int)uVar8 < 2) {
                        uVar18 = 1;
                      }
                      uVar11 = 0;
                      do {
                        pRVar10[uVar11] = -1.0;
                        uVar11 = uVar11 + 1;
                      } while (uVar18 != uVar11);
                      bVar26 = true;
                      uVar8 = uVar7;
                      local_128 = pRVar10;
                    }
                    if (bVar26) {
                      if (0 < local_170->max) {
                        iVar14 = 0;
                        do {
                          RVar6 = ref_cell_nodes(local_170,iVar14,(REF_INT *)local_a8);
                          if (((RVar6 == 0) && (local_a8[3] == uVar5)) && (0 < local_170->node_per))
                          {
                            lVar15 = 0;
                            do {
                              uVar8 = ref_geom_find(local_160,local_a8[lVar15],2,uVar5,&local_174);
                              if (uVar8 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                       ,0x485,"ref_facelift_face_tec_zone",(ulong)uVar8,"find");
                                goto LAB_001b9226;
                              }
                              uVar8 = ref_geom_cell_tuv(local_160,local_a8[lVar15],
                                                        (REF_INT *)local_a8,2,(REF_DBL *)&local_d8,
                                                        (REF_INT *)&local_fc);
                              if (uVar8 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                       ,0x488,"ref_facelift_face_tec_zone",(ulong)uVar8);
                                goto LAB_001b9226;
                              }
                              if (local_160->descr[(long)local_174 * 6 + 4] == 0) {
                                if (local_fc < 2) {
                                  uVar8 = ref_dict_location(local_158,local_a8[lVar15],&local_164);
                                  if (uVar8 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                           ,0x48b,"ref_facelift_face_tec_zone",(ulong)uVar8);
                                    goto LAB_001b9226;
                                  }
                                }
                                else {
                                  uVar8 = ref_dict_location(local_140,local_a8[lVar15],&local_164);
                                  if (uVar8 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                           ,0x48e,"ref_facelift_face_tec_zone",(ulong)uVar8);
                                    goto LAB_001b9226;
                                  }
                                  local_164 = local_164 + (int)local_e0;
                                }
                              }
                              else {
                                uVar8 = ref_dict_location(local_148,iVar14,&local_164);
                                if (uVar8 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                         ,0x492,"ref_facelift_face_tec_zone",(ulong)uVar8);
                                  goto LAB_001b9226;
                                }
                                local_164 = local_164 + (int)local_118;
                              }
                              local_128[(long)local_164 * 2] = (REF_DBL)local_d8;
                              local_128[local_164 * 2 + 1] = (REF_DBL)local_d0;
                              lVar15 = lVar15 + 1;
                            } while (lVar15 < local_170->node_per);
                          }
                          iVar14 = iVar14 + 1;
                        } while (iVar14 < local_170->max);
                      }
                      local_174 = -1;
                      iVar14 = -1;
                      if (0 < local_158->n) {
                        iVar14 = *local_158->key;
                        local_174 = *local_158->value;
                      }
                      if (0 < local_158->n) {
                        pRVar10 = local_128;
                        lVar15 = 1;
                        do {
                          pRVar3 = local_150->real;
                          lVar12 = (long)(iVar14 * 0xf);
                          local_f8 = (REF_GEOM)pRVar3[lVar12];
                          local_f0 = (REF_GEOM)pRVar3[lVar12 + 1];
                          local_e8 = (REF_GEOM)pRVar3[lVar12 + 2];
                          if ((local_160->model != (void *)0x0) &&
                             (uVar8 = ref_egads_eval_at(local_160,2,uVar5,pRVar10,
                                                        (REF_DBL *)&local_f8,(REF_DBL *)0x0),
                             uVar8 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x4a2,"ref_facelift_face_tec_zone",(ulong)uVar8);
                            goto LAB_001b9226;
                          }
                          pRVar3 = local_120->displacement;
                          lVar12 = (long)local_174;
                          dVar27 = pRVar3[lVar12 * 3 + 2] * pRVar3[lVar12 * 3 + 2] +
                                   pRVar3[lVar12 * 3 + 1] * pRVar3[lVar12 * 3 + 1] +
                                   pRVar3[lVar12 * 3] * pRVar3[lVar12 * 3];
                          if (dVar27 < 0.0) {
                            local_138 = local_f8;
                            local_110 = local_f0;
                            local_108 = local_e8;
                            dVar27 = sqrt(dVar27);
                            pRVar13 = local_110;
                            pRVar28 = local_108;
                            pRVar20 = local_138;
                          }
                          else {
                            dVar27 = SQRT(dVar27);
                            pRVar13 = local_f0;
                            pRVar28 = local_e8;
                            pRVar20 = local_f8;
                          }
                          pRVar3 = local_120->displacement;
                          lVar12 = (long)local_174;
                          pcVar30 = (char *)pRVar3[lVar12 * 3 + 2];
                          fprintf(local_130,
                                  " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar20
                                  ,pRVar13,pRVar28,dVar27,*pRVar10,pRVar10[1],pRVar3[lVar12 * 3],
                                  pRVar3[lVar12 * 3 + 1]);
                          local_174 = -1;
                          iVar14 = -1;
                          if (lVar15 < local_158->n) {
                            iVar14 = local_158->key[lVar15];
                            local_174 = local_158->value[lVar15];
                          }
                          pRVar10 = pRVar10 + 2;
                          bVar26 = lVar15 < local_158->n;
                          lVar15 = lVar15 + 1;
                        } while (bVar26);
                      }
                      local_174 = -1;
                      iVar14 = -1;
                      if (0 < local_140->n) {
                        iVar14 = *local_140->key;
                        local_174 = *local_140->value;
                      }
                      if (0 < local_140->n) {
                        pRVar10 = local_128 + local_e0 * 2;
                        lVar15 = 1;
                        do {
                          pRVar3 = local_150->real;
                          lVar12 = (long)(iVar14 * 0xf);
                          local_f8 = (REF_GEOM)pRVar3[lVar12];
                          local_f0 = (REF_GEOM)pRVar3[lVar12 + 1];
                          local_e8 = (REF_GEOM)pRVar3[lVar12 + 2];
                          if ((local_160->model != (void *)0x0) &&
                             (uVar8 = ref_egads_eval_at(local_160,2,uVar5,pRVar10,
                                                        (REF_DBL *)&local_f8,(REF_DBL *)0x0),
                             uVar8 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x4b2,"ref_facelift_face_tec_zone",(ulong)uVar8,"eval at",
                                   pcVar30);
                            goto LAB_001b9226;
                          }
                          pRVar3 = local_120->displacement;
                          lVar12 = (long)local_174;
                          dVar27 = pRVar3[lVar12 * 3 + 2] * pRVar3[lVar12 * 3 + 2] +
                                   pRVar3[lVar12 * 3 + 1] * pRVar3[lVar12 * 3 + 1] +
                                   pRVar3[lVar12 * 3] * pRVar3[lVar12 * 3];
                          if (dVar27 < 0.0) {
                            local_138 = local_f8;
                            local_110 = local_f0;
                            local_108 = local_e8;
                            dVar27 = sqrt(dVar27);
                            pRVar13 = local_110;
                            pRVar28 = local_108;
                            pRVar20 = local_138;
                          }
                          else {
                            dVar27 = SQRT(dVar27);
                            pRVar13 = local_f0;
                            pRVar28 = local_e8;
                            pRVar20 = local_f8;
                          }
                          pRVar3 = local_120->displacement;
                          lVar12 = (long)local_174;
                          pcVar30 = (char *)pRVar3[lVar12 * 3 + 2];
                          fprintf(local_130,
                                  " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar20
                                  ,pRVar13,pRVar28,dVar27,*pRVar10,pRVar10[1],pRVar3[lVar12 * 3],
                                  pRVar3[lVar12 * 3 + 1]);
                          local_174 = -1;
                          iVar14 = -1;
                          if (lVar15 < local_140->n) {
                            iVar14 = local_140->key[lVar15];
                            local_174 = local_140->value[lVar15];
                          }
                          pRVar10 = pRVar10 + 2;
                          bVar26 = lVar15 < local_140->n;
                          lVar15 = lVar15 + 1;
                        } while (bVar26);
                      }
                      if (0 < local_148->n) {
                        RVar17 = *local_148->value;
                        pRVar10 = local_128 + (long)(int)local_118 * 2;
                        pRVar13 = (REF_GEOM)0x1;
                        do {
                          local_138 = pRVar13;
                          uVar8 = ref_geom_find(local_160,RVar17,2,uVar5,&local_174);
                          if (uVar8 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x4bc,"ref_facelift_face_tec_zone",(ulong)uVar8,"find",pcVar30);
                            goto LAB_001b9226;
                          }
                          pRVar3 = local_150->real;
                          lVar15 = (long)(RVar17 * 0xf);
                          local_f8 = (REF_GEOM)pRVar3[lVar15];
                          local_f0 = (REF_GEOM)pRVar3[lVar15 + 1];
                          local_e8 = (REF_GEOM)pRVar3[lVar15 + 2];
                          if ((local_160->model != (void *)0x0) &&
                             (uVar8 = ref_egads_eval_at(local_160,2,uVar5,pRVar10,
                                                        (REF_DBL *)&local_f8,(REF_DBL *)0x0),
                             uVar8 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x4c3,"ref_facelift_face_tec_zone",(ulong)uVar8);
                            goto LAB_001b9226;
                          }
                          pRVar3 = local_120->displacement;
                          lVar15 = (long)local_174;
                          dVar27 = pRVar3[lVar15 * 3 + 2] * pRVar3[lVar15 * 3 + 2] +
                                   pRVar3[lVar15 * 3 + 1] * pRVar3[lVar15 * 3 + 1] +
                                   pRVar3[lVar15 * 3] * pRVar3[lVar15 * 3];
                          if (dVar27 < 0.0) {
                            local_110 = local_f8;
                            local_108 = local_f0;
                            local_b0 = local_e8;
                            dVar27 = sqrt(dVar27);
                            pRVar13 = local_108;
                            pRVar28 = local_b0;
                            pRVar20 = local_110;
                          }
                          else {
                            dVar27 = SQRT(dVar27);
                            pRVar13 = local_f0;
                            pRVar28 = local_e8;
                            pRVar20 = local_f8;
                          }
                          pRVar19 = local_138;
                          pRVar3 = local_120->displacement;
                          lVar15 = (long)local_174;
                          pcVar30 = (char *)pRVar3[lVar15 * 3 + 2];
                          fprintf(local_130,
                                  " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar20
                                  ,pRVar13,pRVar28,dVar27,*pRVar10,pRVar10[1],pRVar3[lVar15 * 3],
                                  pRVar3[lVar15 * 3 + 1]);
                          RVar17 = -1;
                          if ((long)pRVar19 < (long)local_148->n) {
                            RVar17 = local_148->value[(long)pRVar19];
                          }
                          pRVar13 = (REF_GEOM)((long)&pRVar19->n + 1);
                          pRVar10 = pRVar10 + 2;
                        } while ((long)pRVar19 < (long)local_148->n);
                      }
                      if (local_128 != (REF_DBL *)0x0) {
                        free(local_128);
                      }
                      if (0 < local_170->max) {
                        RVar17 = 0;
                        do {
                          RVar6 = ref_cell_nodes(local_170,RVar17,(REF_INT *)local_a8);
                          if ((RVar6 == 0) && (local_a8[3] == uVar5)) {
                            if (0 < local_170->node_per) {
                              lVar15 = 0;
                              local_150 = (REF_NODE)CONCAT44(local_150._4_4_,RVar17);
                              do {
                                uVar8 = ref_geom_find(local_160,local_a8[lVar15],2,uVar5,&local_174)
                                ;
                                if (uVar8 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                         ,0x4d2,"ref_facelift_face_tec_zone",(ulong)uVar8,"find");
                                  goto LAB_001b9226;
                                }
                                uVar8 = ref_geom_cell_tuv(local_160,local_a8[lVar15],
                                                          (REF_INT *)local_a8,2,(REF_DBL *)&local_d8
                                                          ,(REF_INT *)&local_fc);
                                if (uVar8 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                         ,0x4d5,"ref_facelift_face_tec_zone",(ulong)uVar8,"cell tuv"
                                        );
                                  goto LAB_001b9226;
                                }
                                if (local_160->descr[(long)local_174 * 6 + 4] == 0) {
                                  if (local_fc < 2) {
                                    uVar8 = ref_dict_location(local_158,local_a8[lVar15],&local_164)
                                    ;
                                    if (uVar8 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                             ,0x4d8,"ref_facelift_face_tec_zone",(ulong)uVar8,
                                             "localize");
                                      goto LAB_001b9226;
                                    }
                                  }
                                  else {
                                    uVar8 = ref_dict_location(local_140,local_a8[lVar15],&local_164)
                                    ;
                                    if (uVar8 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                             ,0x4db,"ref_facelift_face_tec_zone",(ulong)uVar8,
                                             "localize");
                                      goto LAB_001b9226;
                                    }
                                    local_164 = local_164 + (int)local_e0;
                                  }
                                }
                                else {
                                  uVar8 = ref_dict_location(local_148,RVar17,&local_164);
                                  if (uVar8 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                           ,0x4df,"ref_facelift_face_tec_zone",(ulong)uVar8,
                                           "localize");
                                    goto LAB_001b9226;
                                  }
                                  local_164 = local_164 + (int)local_118;
                                }
                                pRVar21 = local_170;
                                fprintf(local_130," %d",(ulong)(local_164 + 1));
                                lVar15 = lVar15 + 1;
                                RVar17 = (REF_INT)local_150;
                              } while (lVar15 < pRVar21->node_per);
                            }
                            fputc(10,local_130);
                          }
                          RVar17 = RVar17 + 1;
                        } while (RVar17 < local_170->max);
                      }
                      uVar8 = ref_dict_free(local_148);
                      if (uVar8 == 0) {
                        uVar8 = ref_dict_free(local_140);
                        if (uVar8 == 0) {
                          uVar8 = ref_dict_free(local_158);
                          if (uVar8 == 0) goto LAB_001ba377;
                          uVar16 = 0x4ea;
LAB_001b967f:
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                 ,uVar16,"ref_facelift_face_tec_zone",(ulong)uVar8,"free dict");
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                 ,0x4e9,"ref_facelift_face_tec_zone",(ulong)uVar8,"free jump");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x4e8,"ref_facelift_face_tec_zone",(ulong)uVar8,"free degen");
                      }
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x452,"ref_facelift_face_tec_zone",(ulong)uVar8,"create dict");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x451,"ref_facelift_face_tec_zone",(ulong)uVar8,"create dict");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x450,"ref_facelift_face_tec_zone",(ulong)uVar7,"create dict");
              uVar8 = uVar7;
            }
          }
LAB_001b9226:
          if (uVar8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x512,"ref_facelift_tec",(ulong)uVar8,"tec face");
            return uVar8;
          }
          bVar26 = uVar5 != uVar23;
          uVar5 = uVar5 + 1;
        } while (bVar26);
      }
      fclose(local_130);
      RVar6 = 0;
    }
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_tec(REF_FACELIFT ref_facelift,
                                    const char *filename) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine watertight cad displacement\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"d\" \"u\" \"v\" \"dx\" \"dy\" \"dz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_edge_tec_zone(ref_facelift, id, file), "tec edge");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_facelift_face_tec_zone(ref_facelift, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}